

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_results.hpp
# Opt level: O0

basic_resolver_results<asio::ip::tcp> *
asio::ip::basic_resolver_results<asio::ip::tcp>::create
          (addrinfo_type *address_info,string *host_name,string *service_name)

{
  string *service;
  data_type *__dest;
  string *in_RDX;
  long in_RSI;
  string *in_RDI;
  endpoint endpoint;
  string actual_host_name;
  basic_resolver_results<asio::ip::tcp> *results;
  value_type *in_stack_fffffffffffffef8;
  basic_resolver_entry<asio::ip::tcp> *in_stack_ffffffffffffff00;
  vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
  *in_stack_ffffffffffffff08;
  string *host;
  string *ep;
  basic_resolver_entry<asio::ip::tcp> *in_stack_ffffffffffffff30;
  undefined1 local_70 [72];
  undefined4 local_28;
  byte local_21;
  undefined8 local_18;
  long local_10;
  
  local_21 = 0;
  ep = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  basic_resolver_results((basic_resolver_results<asio::ip::tcp> *)0x265561);
  if (local_10 == 0) {
    local_21 = 1;
    local_28 = 1;
  }
  else {
    std::__cxx11::string::string((string *)(local_70 + 0x28),(string *)local_18);
    if (*(long *)(local_10 + 0x20) != 0) {
      std::__cxx11::string::operator=((string *)(local_70 + 0x28),*(char **)(local_10 + 0x20));
    }
    host = in_RDI;
    service = (string *)operator_new(0x18);
    std::
    vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
    ::vector((vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
              *)0x26561e);
    std::
    __shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    reset<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>>>
              ((__shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                *)in_RDI,in_stack_ffffffffffffff08);
    for (; local_10 != 0; local_10 = *(long *)(local_10 + 0x28)) {
      if ((*(int *)(local_10 + 4) == 2) || (*(int *)(local_10 + 4) == 10)) {
        basic_endpoint<asio::ip::tcp>::basic_endpoint((basic_endpoint<asio::ip::tcp> *)0x265672);
        basic_endpoint<asio::ip::tcp>::resize
                  (&in_stack_ffffffffffffff00->endpoint_,(size_t)in_stack_fffffffffffffef8);
        in_stack_fffffffffffffef8 = (value_type *)local_70;
        __dest = basic_endpoint<asio::ip::tcp>::data((basic_endpoint<asio::ip::tcp> *)0x26569c);
        memcpy(__dest,*(void **)(local_10 + 0x18),(ulong)*(uint *)(local_10 + 0x10));
        in_stack_ffffffffffffff00 =
             (basic_resolver_entry<asio::ip::tcp> *)
             std::
             __shared_ptr_access<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2656bf);
        basic_resolver_entry<asio::ip::tcp>::basic_resolver_entry
                  (in_stack_ffffffffffffff30,(endpoint_type *)ep,host,service);
        std::
        vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
        ::push_back((vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                     *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        basic_resolver_entry<asio::ip::tcp>::~basic_resolver_entry(in_stack_ffffffffffffff00);
      }
    }
    local_21 = 1;
    local_28 = 1;
    std::__cxx11::string::~string((string *)(local_70 + 0x28));
  }
  if ((local_21 & 1) == 0) {
    ~basic_resolver_results((basic_resolver_results<asio::ip::tcp> *)0x26577f);
  }
  return (basic_resolver_results<asio::ip::tcp> *)ep;
}

Assistant:

static basic_resolver_results create(
      asio::detail::addrinfo_type* address_info,
      const std::string& host_name, const std::string& service_name)
  {
    basic_resolver_results results;
    if (!address_info)
      return results;

    std::string actual_host_name = host_name;
    if (address_info->ai_canonname)
      actual_host_name = address_info->ai_canonname;

    results.values_.reset(new values_type);

    while (address_info)
    {
      if (address_info->ai_family == ASIO_OS_DEF(AF_INET)
          || address_info->ai_family == ASIO_OS_DEF(AF_INET6))
      {
        using namespace std; // For memcpy.
        typename InternetProtocol::endpoint endpoint;
        endpoint.resize(static_cast<std::size_t>(address_info->ai_addrlen));
        memcpy(endpoint.data(), address_info->ai_addr,
            address_info->ai_addrlen);
        results.values_->push_back(
            basic_resolver_entry<InternetProtocol>(endpoint,
              actual_host_name, service_name));
      }
      address_info = address_info->ai_next;
    }

    return results;
  }